

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

bool whisper_kv_cache_init
               (whisper_kv_cache *cache,ggml_backend_t backend,ggml_type wtype,int64_t n_text_state,
               int64_t n_text_layer,int n_ctx)

{
  pointer pwVar1;
  pointer pwVar2;
  long lVar3;
  ggml_tensor *pgVar4;
  ggml_backend_buffer_t pgVar5;
  char *format;
  pointer pwVar6;
  long lVar7;
  
  lVar3 = ggml_tensor_overhead();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&cache->ctx_buf,lVar3 * 2);
  cache->head = 0;
  cache->size = n_ctx;
  pwVar1 = (cache->cells).super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pwVar2 = (cache->cells).super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pwVar6 = pwVar1;
  if (pwVar2 != pwVar1) {
    do {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&(pwVar6->seq_id)._M_t);
      pwVar6 = pwVar6 + 1;
    } while (pwVar6 != pwVar2);
    (cache->cells).super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>._M_impl.
    super__Vector_impl_data._M_finish = pwVar1;
  }
  std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::resize(&cache->cells,(long)n_ctx);
  lVar3 = ggml_init();
  if (lVar3 == 0) {
    format = "%s: failed to allocate memory for the kv cache context\n";
  }
  else {
    lVar7 = n_text_layer * n_text_state * (long)n_ctx;
    pgVar4 = (ggml_tensor *)ggml_new_tensor_1d(lVar3,wtype,lVar7);
    cache->k = pgVar4;
    pgVar4 = (ggml_tensor *)ggml_new_tensor_1d(lVar3,wtype,lVar7);
    cache->v = pgVar4;
    pgVar5 = (ggml_backend_buffer_t)ggml_backend_alloc_ctx_tensors(lVar3,backend);
    cache->buffer = pgVar5;
    if (pgVar5 != (ggml_backend_buffer_t)0x0) {
      ggml_backend_buffer_clear(pgVar5,0);
      ggml_free(lVar3);
      return true;
    }
    format = "%s: failed to allocate memory for the kv cache\n";
  }
  whisper_log_internal(GGML_LOG_LEVEL_ERROR,format,"whisper_kv_cache_init");
  return false;
}

Assistant:

static bool whisper_kv_cache_init(
             struct whisper_kv_cache & cache,
                      ggml_backend_t   backend,
                           ggml_type   wtype,
                             int64_t   n_text_state,
                             int64_t   n_text_layer,
                                 int   n_ctx) {
    const int64_t n_mem      = n_text_layer*n_ctx;
    const int64_t n_elements = n_text_state*n_mem;

    cache.ctx_buf.resize(2*ggml_tensor_overhead());

    struct ggml_init_params params = {
        /*.mem_size   =*/ cache.ctx_buf.size(),
        /*.mem_buffer =*/ cache.ctx_buf.data(),
        /*.no_alloc   =*/ true,
    };

    cache.head = 0;
    cache.size = n_ctx;

    cache.cells.clear();
    cache.cells.resize(n_ctx);

    struct ggml_context * ctx = ggml_init(params);

    if (!ctx) {
        WHISPER_LOG_ERROR("%s: failed to allocate memory for the kv cache context\n", __func__);
        return false;
    }

    cache.k = ggml_new_tensor_1d(ctx, wtype, n_elements);
    cache.v = ggml_new_tensor_1d(ctx, wtype, n_elements);

    cache.buffer = ggml_backend_alloc_ctx_tensors(ctx, backend);
    if (!cache.buffer) {
        WHISPER_LOG_ERROR("%s: failed to allocate memory for the kv cache\n", __func__);
        return false;
    }

    ggml_backend_buffer_clear(cache.buffer, 0);

    ggml_free(ctx);

    return true;
}